

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::BuildFieldOrExtension
          (DescriptorBuilder *this,FieldDescriptorProto *proto,Descriptor *parent,
          FieldDescriptor *result,bool is_extension,FlatAllocator *alloc)

{
  MaybeInitializedPtr *pMVar1;
  MaybeInitializedPtr MVar2;
  ArenaStringPtr this_00;
  ushort *puVar3;
  double dVar4;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_03;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  bool bVar7;
  int32_t iVar8;
  int iVar9;
  undefined8 *puVar10;
  TaggedStringPtr TVar11;
  _Storage<google::protobuf::internal::DescriptorNames,_true> _Var12;
  long *plVar13;
  long lVar14;
  size_t *psVar16;
  string *psVar17;
  byte bVar18;
  char cVar19;
  TaggedStringPtr TVar20;
  char *pcVar21;
  int64_t iVar22;
  uint uVar23;
  MaybeInitializedPtr MVar24;
  Proto *unaff_RBP;
  undefined7 in_register_00000081;
  TaggedStringPtr TVar25;
  undefined1 lower_first;
  TaggedStringPtr unaff_R12;
  char *pcVar26;
  TaggedStringPtr TVar27;
  TaggedStringPtr unaff_R15;
  float fVar28;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes_01;
  string_view element_name;
  string_view name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view element_name_03;
  string_view element_name_04;
  string_view element_name_05;
  string_view element_name_06;
  string_view element_name_07;
  string_view element_name_08;
  string_view full_name;
  string_view element_name_09;
  string_view element_name_10;
  string_view source;
  string_view element_name_11;
  string_view element_name_12;
  string_view input;
  string_view input_00;
  string_view input_01;
  initializer_list<unsigned_long> sizes;
  initializer_list<unsigned_long> sizes_00;
  initializer_list<unsigned_long> sizes_01;
  string_view name_00;
  string_view full_name_00;
  optional<google::protobuf::internal::DescriptorNames> oVar29;
  string_view option_name;
  string_view name_01;
  string camelcase_name;
  string lowercase_name;
  string json_name;
  char *end_pos;
  string value;
  undefined1 local_210 [56];
  string local_1d8;
  MaybeInitializedPtr local_1b8;
  ArenaStringPtr local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [2];
  MaybeInitializedPtr local_188;
  FieldOptions *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  Proto *local_168;
  VoidPtr local_160;
  code *pcStack_158;
  VoidPtr local_150;
  code *pcStack_148;
  VoidPtr local_140;
  code *pcStack_138;
  VoidPtr local_130;
  code *pcStack_128;
  VoidPtr local_120;
  code *pcStack_118;
  HeapOrSoo local_110;
  _anonymous_namespace_ *local_100;
  TaggedStringPtr local_f8;
  _anonymous_namespace_ *local_f0;
  TaggedStringPtr local_e8;
  _anonymous_namespace_ *local_e0;
  TaggedStringPtr local_d8;
  HeapOrSoo local_d0;
  undefined1 local_c0 [8];
  char *pcStack_b8;
  undefined1 local_b0 [80];
  ulong local_60;
  char *local_58;
  TaggedStringPtr local_50;
  MaybeInitializedPtr local_48;
  string_view local_40;
  ulong uVar15;
  AlphaNum *c;
  
  TVar25.ptr_._1_7_ = in_register_00000081;
  TVar25.ptr_._0_1_ = is_extension;
  if (parent == (Descriptor *)0x0) {
    pMVar1 = (MaybeInitializedPtr *)this->file_->package_;
    local_210._16_8_ = *pMVar1;
    TVar20.ptr_ = pMVar1[1].p;
  }
  else {
    pcVar26 = (parent->all_names_).payload_;
    TVar20.ptr_._2_6_ = 0;
    TVar20.ptr_._0_2_ = *(ushort *)(pcVar26 + 2);
    local_210._16_8_ = pcVar26 + ~(ulong)TVar20.ptr_;
  }
  TVar27.ptr_ = (long *)0x0;
  if ((undefined1  [80])((undefined1  [80])proto->field_0 & (undefined1  [80])0x10) !=
      (undefined1  [80])0x0) {
    TVar27.ptr_ = (long *)((ulong)(proto->field_0)._impl_.json_name_.tagged_ptr_.ptr_ &
                          0xfffffffffffffffc);
  }
  local_210._0_8_ = result;
  local_210._8_8_ = parent;
  local_210._24_8_ = TVar25.ptr_;
  if ((alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).pointers_.payload_.super_Base<char>.value == (PointerT<char>)0x0) {
    BuildFieldOrExtension((DescriptorBuilder *)&local_d0.heap);
    goto LAB_0016afc7;
  }
  puVar10 = (undefined8 *)
            ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  MVar2.p = (void *)*puVar10;
  this_00.tagged_ptr_.ptr_ = (TaggedStringPtr)puVar10[1];
  pcVar26 = "";
  if (TVar20.ptr_ != (void *)0x0) {
    pcVar26 = ".";
  }
  uVar15 = CONCAT71(0,TVar20.ptr_ != (void *)0x0);
  MVar24.p = (_anonymous_namespace_ *)((long)TVar20.ptr_ + (long)this_00.tagged_ptr_.ptr_) + uVar15;
  local_210._32_8_ = alloc;
  local_210._40_8_ = TVar20.ptr_;
  local_210._48_8_ = this;
  local_168 = proto;
  local_110.heap.control = (ctrl_t *)this_00.tagged_ptr_.ptr_;
  local_110.heap.slot_array = (MaybeInitializedPtr)MVar24.p;
  if ((long *)TVar27.ptr_ == (long *)0x0) {
    local_f8.ptr_ = (void *)this_00.tagged_ptr_.ptr_;
    if (this_00.tagged_ptr_.ptr_ != (void *)0x0) {
      if (0x19 < (byte)(*MVar2.p + 0x9fU)) goto LAB_0016a10b;
      TVar11.ptr_ = (FieldOptions *)0x0;
      bVar7 = false;
      do {
        cVar19 = *(char *)((long)&(((FieldOptions *)TVar11.ptr_)->super_Message).super_MessageLite.
                                  _vptr_MessageLite + (long)MVar2.p);
        if ((byte)(cVar19 + 0xbfU) < 0x1a) goto LAB_0016a10b;
        if (cVar19 == '_') {
          bVar7 = true;
        }
        TVar11.ptr_ = (void *)((long)&(((FieldOptions *)TVar11.ptr_)->super_Message).
                                      super_MessageLite._vptr_MessageLite + 1);
      } while (this_00.tagged_ptr_.ptr_ != (TaggedStringPtr)TVar11.ptr_);
      if (!bVar7) goto LAB_0016a401;
      input_00._M_str = (char *)0x1;
      input_00._M_len = (size_t)MVar2.p;
      (anonymous_namespace)::ToCamelCase_abi_cxx11_
                ((string *)&local_1b8,(_anonymous_namespace_ *)this_00.tagged_ptr_.ptr_,input_00,
                 is_extension);
      alloc = (FlatAllocator *)local_210._32_8_;
      local_d0.heap.control = (ctrl_t *)local_1b0.tagged_ptr_.ptr_;
      local_d0.heap.slot_array.p = local_1b8;
      _local_c0 = anon_unknown_24::
                  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                  ::AllocatePlaceholderNames::kNullChar;
      local_b0._0_8_ = local_210._40_8_;
      local_b0._8_8_ = local_210._16_8_;
      local_b0._24_8_ = pcVar26;
      local_b0._16_8_ = uVar15;
      local_b0._48_8_ =
           anon_unknown_24::
           FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ::AllocatePlaceholderNames::kNullChar._M_len;
      local_b0._56_8_ =
           anon_unknown_24::
           FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ::AllocatePlaceholderNames::kNullChar._M_str;
      local_100 = (_anonymous_namespace_ *)((long)this_00.tagged_ptr_.ptr_ + 1);
      local_f0 = (_anonymous_namespace_ *)((long)MVar24.p + 2) + (long)local_1b0.tagged_ptr_.ptr_;
      local_e8 = local_1b0.tagged_ptr_.ptr_;
      local_d8 = local_1b0.tagged_ptr_.ptr_;
      bytes._M_len = 6;
      bytes._M_array = (iterator)&local_d0;
      sizes._M_len = 8;
      sizes._M_array = (iterator)&local_110;
      c = (AlphaNum *)0x8;
      local_e0 = local_f0;
      local_b0._32_8_ = this_00.tagged_ptr_.ptr_;
      local_b0._40_8_ = MVar2.p;
      oVar29 = anon_unknown_24::
               FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ::CreateDescriptorNames
                         ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           *)local_210._32_8_,bytes,sizes);
      _Var12 = oVar29.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
               _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
               _M_payload;
      uVar23 = oVar29.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
               _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
               _8_4_;
      TVar27.ptr_ = (void *)local_210._24_8_;
      unaff_R15.ptr_ = (void *)local_210._48_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.p == local_1a8) goto LAB_0016a487;
      goto LAB_0016a3ec;
    }
LAB_0016a401:
    local_d0.heap.slot_array.p = (MaybeInitializedPtr)local_210._16_8_;
    pcStack_b8 = pcVar26;
    local_c0 = (undefined1  [8])uVar15;
    local_b0._16_16_ =
         (undefined1  [16])
         anon_unknown_24::
         FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
         ::AllocatePlaceholderNames::kNullChar;
    local_100 = (_anonymous_namespace_ *)((long)this_00.tagged_ptr_.ptr_ + 1);
    bytes_01._M_len = 4;
    bytes_01._M_array = (iterator)&local_d0;
    sizes_01._M_len = 8;
    sizes_01._M_array = (iterator)&local_110;
    c = (AlphaNum *)0x8;
    local_f0 = local_100;
    local_e8.ptr_ = (void *)this_00.tagged_ptr_.ptr_;
    local_e0 = local_100;
    local_d8.ptr_ = (void *)this_00.tagged_ptr_.ptr_;
    local_d0.heap.control = (ctrl_t *)TVar20.ptr_;
    local_b0._0_8_ = this_00.tagged_ptr_.ptr_;
    local_b0._8_8_ = MVar2.p;
    oVar29 = anon_unknown_24::
             FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ::CreateDescriptorNames
                       (&alloc->
                         super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                        ,bytes_01,sizes_01);
    _Var12 = oVar29.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
             _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
             _M_payload;
    uVar23 = oVar29.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
             _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
             _8_4_;
    TVar27.ptr_ = (void *)local_210._24_8_;
    unaff_R15.ptr_ = (void *)local_210._48_8_;
  }
  else {
LAB_0016a10b:
    local_1b8.p = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,MVar2.p,
               (_anonymous_namespace_ *)((long)MVar2.p + (long)this_00.tagged_ptr_.ptr_));
    lower_first = SUB81(TVar25.ptr_,0);
    absl::lts_20250127::AsciiStrToLower((Nonnull<std::string_*>)&local_1b8);
    input._M_str = (char *)0x1;
    input._M_len = (size_t)MVar2.p;
    pcVar21 = (char *)0x1;
    (anonymous_namespace)::ToCamelCase_abi_cxx11_
              ((string *)(local_210 + 0x38),(_anonymous_namespace_ *)this_00.tagged_ptr_.ptr_,input,
               (bool)lower_first);
    if ((long *)TVar27.ptr_ == (long *)0x0) {
      input_01._M_str = pcVar21;
      input_01._M_len = (size_t)MVar2.p;
      (anonymous_namespace)::ToJsonName_abi_cxx11_
                ((string *)&local_188,(_anonymous_namespace_ *)this_00.tagged_ptr_.ptr_,input_01);
    }
    else {
      local_188.p = &local_178;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,*TVar27.ptr_,*(long *)((long)TVar27.ptr_ + 8) + *TVar27.ptr_);
    }
    alloc = (FlatAllocator *)local_210._32_8_;
    TVar27.ptr_ = (void *)local_210._24_8_;
    local_d0.heap.control = (ctrl_t *)local_180;
    local_d0.heap.slot_array.p = local_188;
    _local_c0 = anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocatePlaceholderNames::kNullChar;
    local_b0._0_8_ = local_1d8._M_string_length;
    local_b0._8_8_ = local_1d8._M_dataplus._M_p;
    local_b0._16_8_ =
         anon_unknown_24::
         FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
         ::AllocatePlaceholderNames::kNullChar._M_len;
    local_b0._24_8_ =
         anon_unknown_24::
         FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
         ::AllocatePlaceholderNames::kNullChar._M_str;
    local_b0._32_8_ = local_1b0.tagged_ptr_.ptr_;
    local_b0._40_8_ = local_1b8;
    local_b0._48_8_ =
         anon_unknown_24::
         FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
         ::AllocatePlaceholderNames::kNullChar._M_len;
    local_b0._56_8_ =
         anon_unknown_24::
         FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
         ::AllocatePlaceholderNames::kNullChar._M_str;
    local_b0._64_8_ = local_210._40_8_;
    local_b0._72_8_ = local_210._16_8_;
    local_40 = anon_unknown_24::
               FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ::AllocatePlaceholderNames::kNullChar;
    local_100 = (_anonymous_namespace_ *)((long)MVar24.p + (long)local_1b0.tagged_ptr_.ptr_) + 2;
    local_f8 = local_1b0.tagged_ptr_.ptr_;
    local_f0 = (_anonymous_namespace_ *)
               ((undefined1 *)
                ((long)&(((Message *)local_1d8._M_string_length)->super_MessageLite).
                        _vptr_MessageLite + 3) + (long)MVar24.p + (long)local_1b0.tagged_ptr_.ptr_);
    local_e8.ptr_ = (void *)local_1d8._M_string_length;
    local_e0 = (_anonymous_namespace_ *)((long)MVar24.p + (long)local_1b0.tagged_ptr_.ptr_) +
               (long)(Message *)local_1d8._M_string_length + 4 + (long)&local_180->super_Message;
    local_d8.ptr_ = local_180;
    bytes_00._M_len = 10;
    bytes_00._M_array = (iterator)&local_d0;
    sizes_00._M_len = 8;
    sizes_00._M_array = (iterator)&local_110;
    c = (AlphaNum *)0x8;
    local_60 = uVar15;
    local_58 = pcVar26;
    local_50.ptr_ = (void *)this_00.tagged_ptr_.ptr_;
    local_48.p = MVar2.p;
    oVar29 = anon_unknown_24::
             FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ::CreateDescriptorNames
                       ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         *)local_210._32_8_,bytes_00,sizes_00);
    unaff_R15.ptr_ = (void *)local_210._48_8_;
    _Var12 = oVar29.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
             _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
             _M_payload;
    uVar23 = oVar29.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
             _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
             _8_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.p != &local_178) {
      operator_delete(local_188.p,local_178._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.p != local_1a8) {
LAB_0016a3ec:
      operator_delete(local_1b8.p,local_1a8[0]._M_allocated_capacity + 1);
    }
  }
LAB_0016a487:
  unaff_RBP = local_168;
  if ((uVar23 & 1) == 0) {
    if ((TaggedStringPtr)local_210._40_8_ == (TaggedStringPtr)0x0) {
      plVar13 = (long *)((ulong)(local_168->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc);
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      lVar14 = *plVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_210 + 0x38),lVar14,plVar13[1] + lVar14);
    }
    else {
      local_d0.heap.control = (ctrl_t *)local_210._40_8_;
      local_d0.heap.slot_array = (MaybeInitializedPtr)local_210._16_8_;
      local_110.heap.control = (ctrl_t *)0x1;
      local_110.heap.slot_array =
           (MaybeInitializedPtr)
           ((long)
            "\", which is not defined. The innermost scope is searched first in name resolution. Consider using a leading \'.\'(i.e., \"."
           + 0x77);
      puVar10 = (undefined8 *)
                ((ulong)(local_168->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      local_1b0.tagged_ptr_.ptr_ = (TaggedStringPtr)*puVar10;
      local_1b8 = *(MaybeInitializedPtr *)(puVar10 + 1);
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)(local_210 + 0x38),(lts_20250127 *)&local_d0.heap,
                 (AlphaNum *)&local_110.heap,(AlphaNum *)&local_1b8,c);
    }
    element_name._M_str = local_1d8._M_dataplus._M_p;
    element_name._M_len = local_1d8._M_string_length;
    AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name,&unaff_RBP->super_Message,NAME,
             "Name too long.");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    name_00._M_str = "unknown";
    name_00._M_len = 7;
    oVar29 = anon_unknown_24::
             FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ::AllocateEntityNames
                       (&alloc->
                         super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                        ,(string_view)(ZEXT816(0x3995cd) << 0x40),name_00);
    _Var12 = oVar29.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
             _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
             _M_payload;
    if (((undefined1  [16])
         oVar29.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
         _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames> &
        (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__throw_bad_optional_access();
    }
  }
  ((DescriptorNames *)(local_210._0_8_ + 8))->payload_ = (char *)_Var12;
  puVar10 = (undefined8 *)
            ((ulong)(unaff_RBP->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  full_name_00._M_len = (ulong)*(ushort *)((long)_Var12 + 2);
  full_name_00._M_str = (Nullable<std::string_*>)(~full_name_00._M_len + (long)_Var12);
  name._M_str = (char *)*puVar10;
  name._M_len = puVar10[1];
  ValidateSymbolName((DescriptorBuilder *)unaff_R15.ptr_,name,full_name_00,&unaff_RBP->super_Message
                    );
  *(FileDescriptor **)(local_210._0_8_ + 0x10) = *(FileDescriptor **)((long)unaff_R15.ptr_ + 0xb8);
  *(int32_t *)(local_210._0_8_ + 4) = (unaff_RBP->field_0)._impl_.number_;
  *(byte *)(local_210._0_8_ + 1) =
       *(undefined1 *)(local_210._0_8_ + 1) & 0xf7 | (char)TVar27.ptr_ * '\b';
  *(undefined1 *)(local_210._0_8_ + 1) = *(undefined1 *)(local_210._0_8_ + 1) & 0xef;
  *(undefined1 *)(local_210._0_8_ + 3) = *(undefined1 *)(local_210._0_8_ + 3) & 0xfe;
  *(byte *)(local_210._0_8_ + 1) =
       *(undefined1 *)(local_210._0_8_ + 1) & 0xfd |
       (unaff_RBP->field_0)._impl_.proto3_optional_ * '\x02';
  *(undefined1 *)(local_210._0_8_ + 3) = *(undefined1 *)(local_210._0_8_ + 3) | 6;
  if (((unaff_RBP->field_0)._impl_.proto3_optional_ == true) &&
     ((*(FileDescriptor **)((long)unaff_R15.ptr_ + 0xb8))->edition_ != EDITION_PROTO3)) {
    local_d0.heap.control = local_210;
    pcVar26 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
    element_name_00._M_len = (ulong)*(ushort *)(pcVar26 + 2);
    element_name_00._M_str = pcVar26 + ~element_name_00._M_len;
    local_120.obj = &local_d0;
    pcStack_118 = absl::lts_20250127::functional_internal::
                  InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
    ;
    full_name_00._M_str = (Nullable<std::string_*>)0x2;
    make_error.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
    ;
    make_error.ptr_.obj = local_120.obj;
    AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_00,&unaff_RBP->super_Message,TYPE,
             make_error);
  }
  *(byte *)(local_210._0_8_ + 1) =
       *(undefined1 *)(local_210._0_8_ + 1) & 0xfb | *(byte *)&unaff_RBP->field_0 >> 2 & 4;
  *(uint8_t *)(local_210._0_8_ + 2) = *(uint8_t *)((long)&unaff_RBP->field_0 + 0x48);
  *(byte *)(local_210._0_8_ + 1) =
       *(undefined1 *)(local_210._0_8_ + 1) & 0x3f |
       *(char *)((long)&unaff_RBP->field_0 + 0x44) << 6;
  *(byte *)(local_210._0_8_ + 1) =
       *(undefined1 *)(local_210._0_8_ + 1) & 0xdf |
       (0xbf < (byte)*(undefined1 *)(local_210._0_8_ + 1)) << 5;
  bVar18 = *(undefined1 *)(local_210._0_8_ + 1);
  if ((bVar18 & 200) == 0x88) {
    pcVar26 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
    element_name_01._M_len = (ulong)*(ushort *)(pcVar26 + 2);
    element_name_01._M_str = pcVar26 + ~element_name_01._M_len;
    local_d0.heap.control = local_210;
    local_130.obj = &local_d0;
    pcStack_128 = absl::lts_20250127::functional_internal::
                  InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
    ;
    full_name_00._M_str = (Nullable<std::string_*>)0x2;
    make_error_00.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
    ;
    make_error_00.ptr_.obj = local_130.obj;
    AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_01,&unaff_RBP->super_Message,TYPE,
             make_error_00);
    bVar18 = *(undefined1 *)(local_210._0_8_ + 1);
  }
  ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
  default_value_int64_t_ = 0;
  *(once_flag **)(local_210._0_8_ + 0x18) = (once_flag *)0x0;
  *(Descriptor **)(local_210._0_8_ + 0x20) = (Descriptor *)0x0;
  *(byte *)(local_210._0_8_ + 1) = bVar18 & 0xfe | *(byte *)&unaff_RBP->field_0 >> 3 & 1;
  uVar23 = *(uint *)&unaff_RBP->field_0;
  if ((uVar23 & 8) != 0) {
    bVar18 = *(undefined1 *)(local_210._0_8_ + 1);
    unaff_R12.ptr_ = alloc;
    if (0xbf < bVar18 != (bool)((bVar18 & 0x20) >> 5)) {
LAB_0016afc7:
      BuildFieldOrExtension();
      goto LAB_0016afe1;
    }
    if ((bVar18 & 0x20) != 0) {
      pcVar26 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
      element_name_02._M_len = (ulong)*(ushort *)(pcVar26 + 2);
      element_name_02._M_str = pcVar26 + ~element_name_02._M_len;
      full_name_00._M_str = (Nullable<std::string_*>)0x4;
      AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_02,&unaff_RBP->super_Message,
               DEFAULT_VALUE,"Repeated fields can\'t have default values.");
      uVar23 = *(uint *)&unaff_RBP->field_0;
    }
  }
  if ((uVar23 >> 10 & 1) == 0) goto switchD_0016a8b6_default;
  if ((uVar23 & 8) == 0) {
    switch(*(undefined4 *)
            (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint8_t *)(local_210._0_8_ + 2) * 4)) {
    case 1:
    case 3:
    case 6:
      ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
      default_value_int32_t_ = 0;
      break;
    case 2:
    case 4:
    case 5:
    case 8:
      ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
      default_value_int64_t_ = 0;
      break;
    case 7:
      ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
      default_value_bool_ = false;
      break;
    case 9:
      if ((internal::init_protobuf_defaults_state & 1) == 0) goto LAB_0016affb;
      goto LAB_0016addb;
    case 10:
      LOCK();
      ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
      default_value_int64_t_ = 0;
      UNLOCK();
    }
    goto switchD_0016a8b6_default;
  }
  local_110.heap.control = (ctrl_t *)0x0;
  switch(*(undefined4 *)
          (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint8_t *)(local_210._0_8_ + 2) * 4)) {
  case 1:
    lVar14 = strtol(*(char **)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
                              0xfffffffffffffffc),(char **)&local_110,0);
    iVar8 = (int32_t)lVar14;
    goto LAB_0016ac7e;
  case 2:
    psVar17 = (string *)
              strtoll(*(char **)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_
                                & 0xfffffffffffffffc),(char **)&local_110,0);
    goto LAB_0016ae5d;
  case 3:
    uVar15 = strtoul(*(char **)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
                               0xfffffffffffffffc),(char **)&local_110,0);
    iVar8 = (int32_t)uVar15;
LAB_0016ac7e:
    ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
    default_value_int32_t_ = iVar8;
    break;
  case 4:
    psVar17 = (string *)
              strtoull(*(char **)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_
                                 & 0xfffffffffffffffc),(char **)&local_110,0);
LAB_0016ae5d:
    ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
    default_value_string_ = psVar17;
    break;
  case 5:
    iVar9 = std::__cxx11::string::compare
                      ((char *)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
                               0xfffffffffffffffc));
    if (iVar9 == 0) {
      iVar22 = 0x7ff0000000000000;
    }
    else {
      iVar9 = std::__cxx11::string::compare
                        ((char *)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_
                                 & 0xfffffffffffffffc));
      if (iVar9 == 0) {
        iVar22 = -0x10000000000000;
      }
      else {
        iVar9 = std::__cxx11::string::compare
                          ((char *)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.
                                           ptr_ & 0xfffffffffffffffc));
        if (iVar9 != 0) {
          dVar4 = io::NoLocaleStrtod(*(char **)((ulong)(unaff_RBP->field_0)._impl_.default_value_.
                                                       tagged_ptr_.ptr_ & 0xfffffffffffffffc),
                                     (char **)&local_110);
          ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
          default_value_double_ = dVar4;
          break;
        }
        iVar22 = 0x7ff8000000000000;
      }
    }
    ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
    default_value_int64_t_ = iVar22;
    break;
  case 6:
    iVar9 = std::__cxx11::string::compare
                      ((char *)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
                               0xfffffffffffffffc));
    if (iVar9 == 0) {
      ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
      default_value_int32_t_ = 0x7f800000;
    }
    else {
      iVar9 = std::__cxx11::string::compare
                        ((char *)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_
                                 & 0xfffffffffffffffc));
      if (iVar9 == 0) {
        ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
        default_value_int32_t_ = -0x800000;
      }
      else {
        iVar9 = std::__cxx11::string::compare
                          ((char *)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.
                                           ptr_ & 0xfffffffffffffffc));
        if (iVar9 == 0) {
          ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
          default_value_int32_t_ = 0x7fc00000;
        }
        else {
          dVar4 = io::NoLocaleStrtod(*(char **)((ulong)(unaff_RBP->field_0)._impl_.default_value_.
                                                       tagged_ptr_.ptr_ & 0xfffffffffffffffc),
                                     (char **)&local_110);
          fVar28 = io::SafeDoubleToFloat(dVar4);
          ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
          default_value_float_ = fVar28;
        }
      }
    }
    break;
  case 7:
    iVar9 = std::__cxx11::string::compare
                      ((char *)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
                               0xfffffffffffffffc));
    if (iVar9 == 0) {
      ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
      default_value_bool_ = true;
    }
    else {
      iVar9 = std::__cxx11::string::compare
                        ((char *)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_
                                 & 0xfffffffffffffffc));
      if (iVar9 == 0) {
        ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
        default_value_bool_ = false;
      }
      else {
        pcVar26 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
        element_name_10._M_len = (ulong)*(ushort *)(pcVar26 + 2);
        element_name_10._M_str = pcVar26 + ~element_name_10._M_len;
        AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_10,&unaff_RBP->super_Message,
                 DEFAULT_VALUE,"Boolean default must be true or false.");
      }
    }
    break;
  case 8:
    ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
    default_value_int64_t_ = 0;
    break;
  case 9:
    if (*(uint8_t *)(local_210._0_8_ + 2) != 0xc) {
      psVar17 = (anonymous_namespace)::
                FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                ::AllocateStrings<std::__cxx11::string_const&>
                          ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                            *)alloc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((ulong)(unaff_RBP->field_0)._impl_.default_value_.
                                               tagged_ptr_.ptr_ & 0xfffffffffffffffc));
      goto LAB_0016ae5d;
    }
    local_d0.heap.slot_array.p = (MaybeInitializedPtr)0x0;
    auVar5[0xf] = 0;
    auVar5._0_15_ = stack0xffffffffffffff41;
    _local_c0 = (string_view)(auVar5 << 8);
    psVar16 = (size_t *)
              ((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
              0xfffffffffffffffc);
    source._M_str = (char *)&local_d0;
    source._M_len = *psVar16;
    local_d0.heap.control = (ctrl_t *)(Proto *)local_c0;
    bVar7 = absl::lts_20250127::CUnescape
                      ((lts_20250127 *)psVar16[1],source,(Nonnull<std::string_*>)0x0,
                       full_name_00._M_str);
    if (bVar7) {
      psVar17 = (anonymous_namespace)::
                FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                ::AllocateStrings<std::__cxx11::string&>
                          ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                            *)alloc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&local_d0.heap);
      ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
      default_value_string_ = psVar17;
    }
    else {
      pcVar26 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
      element_name_11._M_len = (ulong)*(ushort *)(pcVar26 + 2);
      element_name_11._M_str = pcVar26 + ~element_name_11._M_len;
      AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_11,&unaff_RBP->super_Message,
               DEFAULT_VALUE,"Invalid escaping in default value.");
    }
    if ((Proto *)local_d0.heap.control != (Proto *)local_c0) {
      operator_delete(local_d0.heap.control,(long)local_c0 + 1);
    }
    break;
  case 10:
    pcVar26 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
    element_name_09._M_len = (ulong)*(ushort *)(pcVar26 + 2);
    element_name_09._M_str = pcVar26 + ~element_name_09._M_len;
    AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_09,&unaff_RBP->super_Message,
             DEFAULT_VALUE,"Messages can\'t have default values.");
    *(undefined1 *)(local_210._0_8_ + 1) = *(undefined1 *)(local_210._0_8_ + 1) & 0xfe;
    LOCK();
    ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
    default_value_int64_t_ = 0;
    UNLOCK();
  }
  if (((Proto *)local_110.heap.control != (Proto *)0x0) &&
     ((*(long *)(((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
                 0xfffffffffffffffc) + 8) == 0 ||
      ((_anonymous_namespace_)*local_110.heap.control != (_anonymous_namespace_)0x0)))) {
    pcVar26 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
    element_name_12._M_len = (ulong)*(ushort *)(pcVar26 + 2);
    element_name_12._M_str = pcVar26 + ~element_name_12._M_len;
    local_140.obj = &local_d0;
    local_d0.heap.control = (ctrl_t *)unaff_RBP;
    pcStack_138 = absl::lts_20250127::functional_internal::
                  InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
    ;
    make_error_03.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
    ;
    make_error_03.ptr_.obj = local_140.obj;
    AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_12,&unaff_RBP->super_Message,
             DEFAULT_VALUE,make_error_03);
  }
switchD_0016a8b6_default:
  do {
    if (*(int *)(local_210._0_8_ + 4) < 1) {
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
      ::try_emplace_impl<google::protobuf::Descriptor*const&>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>::iterator,_bool>
                  *)&local_d0.heap,&((DescriptorBuilder *)unaff_R15.ptr_)->message_hints_,
                 (Descriptor **)(local_210 + 8));
      uVar6 = local_d0.heap.slot_array;
      iVar9 = -1;
      if (-1 < *(int *)((long)local_d0.heap.slot_array + 8)) {
        iVar9 = *(int *)((long)local_d0.heap.slot_array + 8);
      }
      uVar23 = iVar9 + 1;
      if (0x1ffffffe < uVar23) {
        uVar23 = 0x1fffffff;
      }
      *(uint *)((long)local_d0.heap.slot_array + 8) = uVar23;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(uVar6 + 0x10))->_M_allocated_capacity == 0) {
        *(Proto **)(uVar6 + 0x10) = unaff_RBP;
        pcVar26 = (char *)(uVar6 + 0x18);
        pcVar26[0] = '\x01';
        pcVar26[1] = '\0';
        pcVar26[2] = '\0';
        pcVar26[3] = '\0';
      }
      pcVar26 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
      element_name_04._M_len = (ulong)*(ushort *)(pcVar26 + 2);
      element_name_04._M_str = pcVar26 + ~element_name_04._M_len;
      AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_04,&unaff_RBP->super_Message,NUMBER,
               "Field numbers must be positive integers.");
      if ((char)TVar27.ptr_ != '\0') goto LAB_0016a94b;
    }
    else {
      if ((char)TVar27.ptr_ != '\0') {
LAB_0016a94b:
        if ((undefined1  [80])((undefined1  [80])unaff_RBP->field_0 & (undefined1  [80])0x2) ==
            (undefined1  [80])0x0) {
          pcVar26 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
          element_name_05._M_len = (ulong)*(ushort *)(pcVar26 + 2);
          element_name_05._M_str = pcVar26 + ~element_name_05._M_len;
          AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_05,&unaff_RBP->super_Message,
                   EXTENDEE,"FieldDescriptorProto.extendee not set for extension field.");
        }
        ((anon_union_8_2_2904990b_for_scope_ *)(local_210._0_8_ + 0x28))->extension_scope =
             (Descriptor *)local_210._8_8_;
        if ((undefined1  [80])((undefined1  [80])unaff_RBP->field_0 & (undefined1  [80])0x80) !=
            (undefined1  [80])0x0) {
          pcVar26 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
          element_name_06._M_len = (ulong)*(ushort *)(pcVar26 + 2);
          element_name_06._M_str = pcVar26 + ~element_name_06._M_len;
          AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_06,&unaff_RBP->super_Message,
                   TYPE,"FieldDescriptorProto.oneof_index should not be set for extensions.");
        }
        goto LAB_0016ab1c;
      }
      if (0x1fffffff < (uint)*(int *)(local_210._0_8_ + 4)) {
        absl::lts_20250127::container_internal::
        raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
        ::try_emplace_impl<google::protobuf::Descriptor*const&>
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>::iterator,_bool>
                    *)&local_d0,&((DescriptorBuilder *)unaff_R15.ptr_)->message_hints_,
                   (Descriptor **)(local_210 + 8));
        uVar6 = local_d0.heap.slot_array;
        iVar9 = -1;
        if (-1 < *(int *)((long)local_d0.heap.slot_array + 8)) {
          iVar9 = *(int *)((long)local_d0.heap.slot_array + 8);
        }
        uVar23 = iVar9 + 1;
        if (0x1ffffffe < uVar23) {
          uVar23 = 0x1fffffff;
        }
        *(uint *)((long)local_d0.heap.slot_array + 8) = uVar23;
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(uVar6 + 0x10))->_M_allocated_capacity == 0) {
          *(Proto **)(uVar6 + 0x10) = unaff_RBP;
          pcVar26 = (char *)(uVar6 + 0x18);
          pcVar26[0] = '\x01';
          pcVar26[1] = '\0';
          pcVar26[2] = '\0';
          pcVar26[3] = '\0';
        }
        pcVar26 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
        element_name_03._M_len = (ulong)*(ushort *)(pcVar26 + 2);
        element_name_03._M_str = pcVar26 + ~element_name_03._M_len;
        pcStack_148 = absl::lts_20250127::functional_internal::
                      InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__3,std::__cxx11::string>
        ;
        make_error_01.invoker_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__3,std::__cxx11::string>
        ;
        make_error_01.ptr_.obj = &local_d0;
        local_150.obj = &local_d0;
        AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_03,&unaff_RBP->super_Message,
                 NUMBER,make_error_01);
        alloc = (FlatAllocator *)local_210._32_8_;
      }
    }
    uVar23 = (unaff_RBP->field_0)._impl_._has_bits_.has_bits_[0];
    cVar19 = (char)uVar23;
    if ((uVar23 & 2) != 0) {
      pcVar26 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
      element_name_07._M_len = (ulong)*(ushort *)(pcVar26 + 2);
      element_name_07._M_str = pcVar26 + ~element_name_07._M_len;
      AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_07,&unaff_RBP->super_Message,
               EXTENDEE,"FieldDescriptorProto.extendee set for non-extension field.");
      cVar19 = (char)(unaff_RBP->field_0)._impl_._has_bits_.has_bits_[0];
    }
    *(undefined8 *)(local_210._0_8_ + 0x20) = local_210._8_8_;
    if (-1 < cVar19) goto LAB_0016ab1c;
    iVar9 = (unaff_RBP->field_0)._impl_.oneof_index_;
    if ((iVar9 < 0) || (*(int *)(local_210._8_8_ + 0x80) <= iVar9)) {
      pcVar26 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
      element_name_08._M_len = (ulong)*(ushort *)(pcVar26 + 2);
      element_name_08._M_str = pcVar26 + ~element_name_08._M_len;
      local_160.obj = &local_d0;
      local_d0.heap.slot_array = (MaybeInitializedPtr)(local_210 + 8);
      pcStack_158 = absl::lts_20250127::functional_internal::
                    InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__4,std::__cxx11::string>
      ;
      make_error_02.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__4,std::__cxx11::string>
      ;
      make_error_02.ptr_.obj = local_160.obj;
      local_d0.heap.control = (ctrl_t *)unaff_RBP;
      AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_08,&unaff_RBP->super_Message,TYPE,
               make_error_02);
      goto LAB_0016ab1c;
    }
    *(undefined1 *)(local_210._0_8_ + 1) = *(undefined1 *)(local_210._0_8_ + 1) | 0x10;
    iVar9 = (unaff_RBP->field_0)._impl_.oneof_index_;
    unaff_R12.ptr_ = alloc;
    if ((long)iVar9 < 0) {
LAB_0016afe1:
      BuildFieldOrExtension();
      alloc = (FlatAllocator *)unaff_R12.ptr_;
    }
    else if (iVar9 < *(int *)(local_210._8_8_ + 0x80)) {
      ((anon_union_8_2_2904990b_for_scope_ *)(local_210._0_8_ + 0x28))->containing_oneof =
           *(OneofDescriptor **)(local_210._8_8_ + 0x48) + iVar9;
      *(byte *)(local_210._0_8_ + 3) =
           (*(undefined1 *)(local_210._0_8_ + 3) & 0xfe |
           (byte)*(undefined1 *)(local_210._0_8_ + 1) >> 1 & 1) ^ 1;
LAB_0016ab1c:
      option_name._M_str = "google.protobuf.FieldOptions";
      option_name._M_len = 0x1c;
      AllocateOptions<google::protobuf::FieldDescriptor>
                ((DescriptorBuilder *)unaff_R15.ptr_,unaff_RBP,(FieldDescriptor *)local_210._0_8_,8,
                 option_name,alloc);
      puVar3 = *(ushort **)(local_210._0_8_ + 8);
      full_name._M_len = (ulong)puVar3[1];
      full_name._M_str = (char *)(~full_name._M_len + (long)puVar3);
      name_01._M_len = (ulong)*puVar3;
      name_01._M_str = (char *)(~name_01._M_len + (long)puVar3);
      *(uint8_t *)local_210._0_8_ = '\x02';
      AddSymbol((DescriptorBuilder *)unaff_R15.ptr_,full_name,(void *)local_210._8_8_,name_01,
                &unaff_RBP->super_Message,(Symbol)local_210._0_8_);
      return;
    }
    BuildFieldOrExtension();
LAB_0016affb:
    internal::InitProtobufDefaultsSlow();
LAB_0016addb:
    ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
    default_value_double_ = (double)&internal::fixed_address_empty_string;
  } while( true );
}

Assistant:

void DescriptorBuilder::BuildFieldOrExtension(const FieldDescriptorProto& proto,
                                              Descriptor* parent,
                                              FieldDescriptor* result,
                                              bool is_extension,
                                              internal::FlatAllocator& alloc) {
  const absl::string_view scope =
      (parent == nullptr) ? file_->package() : parent->full_name();

  // We allocate all names in a single array, and dedup them.
  if (auto names = alloc.AllocateFieldNames(
          proto.name(), scope,
          proto.has_json_name() ? &proto.json_name() : nullptr)) {
    result->all_names_ = *names;
  } else {
    AddError(
        scope.empty() ? proto.name() : absl::StrCat(scope, ".", proto.name()),
        proto, DescriptorPool::ErrorCollector::NAME, "Name too long.");
    result->all_names_ = alloc.AllocateEntityNames("", "unknown").value();
  }

  ValidateSymbolName(proto.name(), result->full_name(), proto);

  result->file_ = file_;
  result->number_ = proto.number();
  result->is_extension_ = is_extension;
  result->is_oneof_ = false;
  result->in_real_oneof_ = false;
  result->proto3_optional_ = proto.proto3_optional();
  result->legacy_proto_ctype_ = FieldOptions::CType_MAX + 1;

  if (proto.proto3_optional() && file_->edition() != Edition::EDITION_PROTO3) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             [&] {
               return absl::StrCat(
                   "The [proto3_optional=true] option may only be set on proto3"
                   "fields, not ",
                   result->full_name());
             });
  }

  result->has_json_name_ = proto.has_json_name();

  result->type_ = proto.type();
  result->label_ = proto.label();
  result->is_repeated_ = result->label_ == FieldDescriptor::LABEL_REPEATED;

  if (result->label_ == FieldDescriptor::LABEL_REQUIRED) {
    // An extension cannot have a required field (b/13365836).
    if (result->is_extension_) {
      AddError(result->full_name(), proto,
               // Error location `TYPE`: we would really like to indicate
               // `LABEL`, but the `ErrorLocation` enum has no entry for this,
               // and we don't necessarily know about all implementations of the
               // `ErrorCollector` interface to extend them to handle the new
               // error location type properly.
               DescriptorPool::ErrorCollector::TYPE, [&] {
                 return absl::StrCat("The extension ", result->full_name(),
                                     " cannot be required.");
               });
    }
  }

  // Some of these may be filled in when cross-linking.
  result->containing_type_ = nullptr;
  result->type_once_ = nullptr;
  result->default_value_enum_ = nullptr;

  result->has_default_value_ = proto.has_default_value();
  if (proto.has_default_value() && result->is_repeated()) {
    AddError(result->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Repeated fields can't have default values.");
  }

  if (proto.has_type()) {
    if (proto.has_default_value()) {
      char* end_pos = nullptr;
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_t_ =
              std::strtol(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          static_assert(sizeof(int64_t) == sizeof(long long),  // NOLINT
                        "sizeof int64_t is not sizeof long long");
          result->default_value_int64_t_ =
              std::strtoll(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_t_ =
              std::strtoul(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          static_assert(
              sizeof(uint64_t) == sizeof(unsigned long long),  // NOLINT
              "sizeof uint64_t is not sizeof unsigned long long");
          result->default_value_uint64_t_ =
              std::strtoull(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          if (proto.default_value() == "inf") {
            result->default_value_float_ =
                std::numeric_limits<float>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_float_ =
                -std::numeric_limits<float>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_float_ =
                std::numeric_limits<float>::quiet_NaN();
          } else {
            result->default_value_float_ = io::SafeDoubleToFloat(
                io::NoLocaleStrtod(proto.default_value().c_str(), &end_pos));
          }
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          if (proto.default_value() == "inf") {
            result->default_value_double_ =
                std::numeric_limits<double>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_double_ =
                -std::numeric_limits<double>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_double_ =
                std::numeric_limits<double>::quiet_NaN();
          } else {
            result->default_value_double_ =
                io::NoLocaleStrtod(proto.default_value().c_str(), &end_pos);
          }
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          if (proto.default_value() == "true") {
            result->default_value_bool_ = true;
          } else if (proto.default_value() == "false") {
            result->default_value_bool_ = false;
          } else {
            AddError(result->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                     "Boolean default must be true or false.");
          }
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = nullptr;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          if (result->type() == FieldDescriptor::TYPE_BYTES) {
            std::string value;
            if (absl::CUnescape(proto.default_value(), &value)) {
              result->default_value_string_ = alloc.AllocateStrings(value);
            } else {
              AddError(result->full_name(), proto,
                       DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                       "Invalid escaping in default value.");
            }
          } else {
            result->default_value_string_ =
                alloc.AllocateStrings(proto.default_value());
          }
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Messages can't have default values.");
          result->has_default_value_ = false;
          result->default_generated_instance_ = nullptr;
          break;
      }

      if (end_pos != nullptr) {
        // end_pos is only set non-null by the parsers for numeric types,
        // above. This checks that the default was non-empty and had no extra
        // junk after the end of the number.
        if (proto.default_value().empty() || *end_pos != '\0') {
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE, [&] {
                     return absl::StrCat("Couldn't parse default value \"",
                                         proto.default_value(), "\".");
                   });
        }
      }
    } else {
      // No explicit default value
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_t_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_t_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_t_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_t_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          result->default_value_float_ = 0.0f;
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          result->default_value_double_ = 0.0;
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          result->default_value_bool_ = false;
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = nullptr;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          result->default_value_string_ = &internal::GetEmptyString();
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          result->default_generated_instance_ = nullptr;
          break;
      }
    }
  }

  if (result->number() <= 0) {
    message_hints_[parent].RequestHintOnFieldNumbers(
        proto, DescriptorPool::ErrorCollector::NUMBER);
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Field numbers must be positive integers.");
  } else if (!is_extension && result->number() > FieldDescriptor::kMaxNumber) {
    // Only validate that the number is within the valid field range if it is
    // not an extension. Since extension numbers are validated with the
    // extendee's valid set of extension numbers, and those are in turn
    // validated against the max allowed number, the check is unnecessary for
    // extension fields.
    // This avoids cross-linking issues that arise when attempting to check if
    // the extendee is a message_set_wire_format message, which has a higher max
    // on extension numbers.
    message_hints_[parent].RequestHintOnFieldNumbers(
        proto, DescriptorPool::ErrorCollector::NUMBER);
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             [&] {
               return absl::Substitute(
                   "Field numbers cannot be greater than $0.",
                   FieldDescriptor::kMaxNumber);
             });
  }

  if (is_extension) {
    if (!proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee not set for extension field.");
    }

    result->scope_.extension_scope = parent;

    if (proto.has_oneof_index()) {
      AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "FieldDescriptorProto.oneof_index should not be set for "
               "extensions.");
    }
  } else {
    if (proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee set for non-extension field.");
    }

    result->containing_type_ = parent;

    if (proto.has_oneof_index()) {
      if (proto.oneof_index() < 0 ||
          proto.oneof_index() >= parent->oneof_decl_count()) {
        AddError(result->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE, [&] {
                   return absl::Substitute(
                       "FieldDescriptorProto.oneof_index $0 is "
                       "out of range for type \"$1\".",
                       proto.oneof_index(), parent->name());
                 });
      } else {
        result->is_oneof_ = true;
        result->scope_.containing_oneof =
            parent->oneof_decl(proto.oneof_index());
        result->in_real_oneof_ = !result->proto3_optional_;
      }
    }
  }

  // Copy options.
  AllocateOptions(proto, result, FieldDescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.FieldOptions", alloc);

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));
}